

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SupportVectorRegressor::SharedDtor(SupportVectorRegressor *this)

{
  if (this != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    if (this->kernel_ != (Kernel *)0x0) {
      (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->coefficients_ != (Coefficients *)0x0) {
      (*(this->coefficients_->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  if (this->_oneof_case_[0] != 0) {
    clear_supportVectors(this);
    return;
  }
  return;
}

Assistant:

void SupportVectorRegressor::SharedDtor() {
  if (this != internal_default_instance()) {
    delete kernel_;
  }
  if (this != internal_default_instance()) {
    delete coefficients_;
  }
  if (has_supportVectors()) {
    clear_supportVectors();
  }
}